

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FramebufferBlitTests::init(FramebufferBlitTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  Context *pCVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  TextureChannelClass TVar10;
  deUint32 dVar11;
  TestNode *pTVar12;
  int *piVar13;
  BlitRectCase *pBVar14;
  char *pcVar15;
  TestNode *node;
  TextureFormat TVar16;
  BlitColorConversionCase *this_00;
  BlitDepthStencilCase *pBVar17;
  ulong extraout_RAX;
  BlitDefaultFramebufferCase *this_01;
  DefaultFramebufferBlitCase *pDVar18;
  ulong uVar19;
  bool local_9f1;
  bool local_8f2;
  bool local_8f1;
  bool local_892;
  bool local_891;
  allocator<char> local_701;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_67a;
  allocator<char> local_679;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f2;
  allocator<char> local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined1 local_56a;
  allocator<char> local_569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  bool local_4e3;
  byte local_4e2;
  allocator<char> local_4e1;
  undefined1 local_4e0 [5];
  bool addNearest;
  bool addLinear;
  string name_3;
  int areaNdx;
  bool filterable;
  deUint32 filter;
  TextureChannelClass fmtClass;
  TextureFormat texFmt_1;
  deUint32 format_1;
  int fmtNdx_1;
  TestCaseGroup *defaultFbGroup;
  Vector<int,_4> local_490;
  Vector<int,_2> local_480;
  Vector<int,_4> local_478;
  Vector<int,_2> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_439;
  Vector<int,_4> local_438;
  Vector<int,_2> local_428;
  Vector<int,_4> local_420;
  Vector<int,_2> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e1;
  Vector<int,_4> local_3e0;
  Vector<int,_2> local_3d0;
  Vector<int,_4> local_3c8;
  Vector<int,_2> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_389;
  Vector<int,_4> local_388;
  Vector<int,_2> local_378;
  Vector<int,_4> local_370;
  Vector<int,_2> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  uint local_338;
  bool local_333;
  bool local_332;
  allocator<char> local_331;
  deUint32 buffers;
  bool stencil;
  bool depth;
  string fmtName;
  TextureFormat texFmt;
  deUint32 format;
  int fmtNdx;
  TestCaseGroup *depthStencilGroup;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  string name_2;
  TextureChannelClass dstType;
  TextureFormat dstTexFmt;
  deUint32 dstFormat;
  TextureChannelClass srcType;
  TextureFormat srcTexFmt;
  deUint32 srcFormat;
  int dstFmtNdx;
  int srcFmtNdx;
  TestCaseGroup *conversionGroup;
  IVec4 dstRect_1;
  IVec4 srcRect_1;
  IVec4 dstSwz_1;
  IVec4 srcSwz_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string name_1;
  int local_160;
  int swzNdx_1;
  int rectNdx_1;
  undefined1 local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_10c [8];
  IVec4 dstRect;
  IVec4 srcRect;
  IVec4 dstSwz;
  IVec4 srcSwz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  int swzNdx;
  int rectNdx;
  TestCaseGroup *rectGroup;
  IVec2 dstSize;
  IVec2 srcSize;
  FramebufferBlitTests *this_local;
  
  if ((init()::copyRects == '\0') && (iVar9 = __cxa_guard_acquire(&init()::copyRects), iVar9 != 0))
  {
    init::copyRects[0].name = "basic";
    tcu::Vector<int,_4>::Vector(&init::copyRects[0].srcRect,10,0x14,0x41,100);
    tcu::Vector<int,_4>::Vector(&init::copyRects[0].dstRect,0x2d,5,100,0x55);
    init::copyRects[1].name = "scale";
    tcu::Vector<int,_4>::Vector(&init::copyRects[1].srcRect,10,0x14,0x41,100);
    tcu::Vector<int,_4>::Vector(&init::copyRects[1].dstRect,0x19,0x1e,0x7d,0x5e);
    init::copyRects[2].name = "out_of_bounds";
    tcu::Vector<int,_4>::Vector(&init::copyRects[2].srcRect,-10,-0xf,100,0x3f);
    tcu::Vector<int,_4>::Vector(&init::copyRects[2].dstRect,0x32,0x1e,0x88,0x90);
    __cxa_guard_release(&init()::copyRects);
  }
  if ((init()::filterConsistencyRects == '\0') &&
     (iVar9 = __cxa_guard_acquire(&init()::filterConsistencyRects), iVar9 != 0)) {
    init::filterConsistencyRects[0].name = "mag";
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[0].srcRect,0x14,10,0x4a,0x58);
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[0].dstRect,10,10,0x5b,0x65);
    init::filterConsistencyRects[1].name = "min";
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[1].srcRect,10,0x14,0x4e,100);
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[1].dstRect,0x14,0x14,0x47,0x50);
    init::filterConsistencyRects[2].name = "out_of_bounds_mag";
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[2].srcRect,0x15,10,0x49,0x52);
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[2].dstRect,0xb,0x2b,0x8d,0x97);
    init::filterConsistencyRects[3].name = "out_of_bounds_min";
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[3].srcRect,0xb,0x15,0x4d,0x61);
    tcu::Vector<int,_4>::Vector(&init::filterConsistencyRects[3].dstRect,0x50,0x52,0x87,0x8b);
    __cxa_guard_release(&init()::filterConsistencyRects);
  }
  if ((init()::swizzles == '\0') && (iVar9 = __cxa_guard_acquire(&init()::swizzles), iVar9 != 0)) {
    init::swizzles[0].name = (char *)0x0;
    tcu::Vector<int,_4>::Vector(&init::swizzles[0].srcSwizzle,0,1,2,3);
    tcu::Vector<int,_4>::Vector(&init::swizzles[0].dstSwizzle,0,1,2,3);
    init::swizzles[1].name = "reverse_src_x";
    tcu::Vector<int,_4>::Vector(&init::swizzles[1].srcSwizzle,2,1,0,3);
    tcu::Vector<int,_4>::Vector(&init::swizzles[1].dstSwizzle,0,1,2,3);
    init::swizzles[2].name = "reverse_src_y";
    tcu::Vector<int,_4>::Vector(&init::swizzles[2].srcSwizzle,0,3,2,1);
    tcu::Vector<int,_4>::Vector(&init::swizzles[2].dstSwizzle,0,1,2,3);
    init::swizzles[3].name = "reverse_dst_x";
    tcu::Vector<int,_4>::Vector(&init::swizzles[3].srcSwizzle,0,1,2,3);
    tcu::Vector<int,_4>::Vector(&init::swizzles[3].dstSwizzle,2,1,0,3);
    init::swizzles[4].name = "reverse_dst_y";
    tcu::Vector<int,_4>::Vector(&init::swizzles[4].srcSwizzle,0,1,2,3);
    tcu::Vector<int,_4>::Vector(&init::swizzles[4].dstSwizzle,0,3,2,1);
    init::swizzles[5].name = "reverse_src_dst_x";
    tcu::Vector<int,_4>::Vector(&init::swizzles[5].srcSwizzle,2,1,0,3);
    tcu::Vector<int,_4>::Vector(&init::swizzles[5].dstSwizzle,2,1,0,3);
    init::swizzles[6].name = "reverse_src_dst_y";
    tcu::Vector<int,_4>::Vector(&init::swizzles[6].srcSwizzle,0,3,2,1);
    tcu::Vector<int,_4>::Vector(&init::swizzles[6].dstSwizzle,0,3,2,1);
    __cxa_guard_release(&init()::swizzles);
  }
  tcu::Vector<int,_2>::Vector(&dstSize,0x7f,0x77);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&rectGroup + 4),0x84,0x80);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rect",
             "Blit rectangle tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 3;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 7;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      pcVar15 = init::copyRects[(int)name.field_2._12_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar15,&local_81);
      srcSwz.m_data[2]._2_1_ = 0;
      srcSwz.m_data[2]._1_1_ = 0;
      if (init::swizzles[(int)name.field_2._8_4_].name == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_a8);
      }
      else {
        std::allocator<char>::allocator();
        srcSwz.m_data[2]._2_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(srcSwz.m_data + 3),"_",(allocator<char> *)((long)srcSwz.m_data + 0xb))
        ;
        srcSwz.m_data[2]._1_1_ = 1;
        std::operator+(&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (srcSwz.m_data + 3),init::swizzles[(int)name.field_2._8_4_].name);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      if ((srcSwz.m_data[2]._1_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)(srcSwz.m_data + 3));
      }
      if ((srcSwz.m_data[2]._2_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)srcSwz.m_data + 0xb));
      }
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(dstSwz.m_data + 2),
                 &init::swizzles[(int)name.field_2._8_4_].srcSwizzle);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(srcRect.m_data + 2),
                 &init::swizzles[(int)name.field_2._8_4_].dstSwizzle);
      iVar5 = name.field_2._12_4_ * 0x28;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz.m_data + 2),0);
      iVar9 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz.m_data + 2),1);
      iVar1 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz.m_data + 2),2);
      iVar2 = *piVar13;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz.m_data + 2),3);
      tcu::Vector<int,_4>::swizzle
                ((Vector<int,_4> *)(dstRect.m_data + 2),iVar5 + 0x33bbf58,iVar9,iVar1,iVar2);
      iVar5 = name.field_2._12_4_ * 0x28;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect.m_data + 2),0);
      iVar9 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect.m_data + 2),1);
      iVar1 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect.m_data + 2),2);
      iVar2 = *piVar13;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect.m_data + 2),3);
      tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_10c,iVar5 + 0x33bbf68,iVar9,iVar1,iVar2);
      pBVar14 = (BlitRectCase *)operator_new(0xe0);
      local_131 = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_nearest");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      BlitRectCase::BlitRectCase
                (pBVar14,pCVar4,pcVar15,"",0x2600,&dstSize,(IVec4 *)(dstRect.m_data + 2),
                 (IVec2 *)((long)&rectGroup + 4),(IVec4 *)local_10c,8);
      local_131 = 0;
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar14);
      std::__cxx11::string::~string((string *)&local_130);
      pBVar14 = (BlitRectCase *)operator_new(0xe0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rectNdx_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_linear");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      BlitRectCase::BlitRectCase
                (pBVar14,pCVar4,pcVar15,"",0x2601,&dstSize,(IVec4 *)(dstRect.m_data + 2),
                 (IVec2 *)((long)&rectGroup + 4),(IVec4 *)local_10c,8);
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar14);
      std::__cxx11::string::~string((string *)&rectNdx_1);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 7;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"nearest_consistency_",&local_1c9);
      std::operator+(&local_1a8,&local_1c8,init::filterConsistencyRects[local_160].name);
      srcSwz_1.m_data[2]._2_1_ = 0;
      srcSwz_1.m_data[2]._1_1_ = 0;
      if (init::swizzles[(int)name_1.field_2._12_4_].name == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1f0);
      }
      else {
        std::allocator<char>::allocator();
        srcSwz_1.m_data[2]._2_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(srcSwz_1.m_data + 3),"_",
                   (allocator<char> *)((long)srcSwz_1.m_data + 0xb));
        srcSwz_1.m_data[2]._1_1_ = 1;
        std::operator+(&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (srcSwz_1.m_data + 3),init::swizzles[(int)name_1.field_2._12_4_].name);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     &local_1a8,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      if ((srcSwz_1.m_data[2]._1_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)(srcSwz_1.m_data + 3));
      }
      if ((srcSwz_1.m_data[2]._2_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)srcSwz_1.m_data + 0xb));
      }
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(dstSwz_1.m_data + 2),
                 &init::swizzles[(int)name_1.field_2._12_4_].srcSwizzle);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(srcRect_1.m_data + 2),
                 &init::swizzles[(int)name_1.field_2._12_4_].dstSwizzle);
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz_1.m_data + 2),0);
      iVar9 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz_1.m_data + 2),1);
      iVar1 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz_1.m_data + 2),2);
      iVar2 = *piVar13;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(dstSwz_1.m_data + 2),3);
      tcu::Vector<int,_4>::swizzle
                ((Vector<int,_4> *)(dstRect_1.m_data + 2),local_160 * 0x28 + 0x33bbfd8,iVar9,iVar1,
                 iVar2);
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect_1.m_data + 2),0);
      iVar9 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect_1.m_data + 2),1);
      iVar1 = *piVar13;
      piVar13 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect_1.m_data + 2),2);
      iVar2 = *piVar13;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(srcRect_1.m_data + 2),3);
      tcu::Vector<int,_4>::swizzle
                ((Vector<int,_4> *)((long)&conversionGroup + 4),local_160 * 0x28 + 0x33bbfe8,iVar9,
                 iVar1,iVar2);
      node = (TestNode *)operator_new(0xe0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar15 = (char *)std::__cxx11::string::c_str();
      BlitNearestFilterConsistencyCase::BlitNearestFilterConsistencyCase
                ((BlitNearestFilterConsistencyCase *)node,pCVar4,pcVar15,
                 "Test consistency of the nearest filter",&dstSize,(IVec4 *)(dstRect_1.m_data + 2),
                 (IVec2 *)((long)&rectGroup + 4),(IVec4 *)((long)&conversionGroup + 4));
      tcu::TestNode::addChild(pTVar12,node);
      std::__cxx11::string::~string((string *)local_188);
    }
  }
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Color conversion tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  for (srcFormat = 0; (int)srcFormat < 0x23; srcFormat = srcFormat + 1) {
    for (srcTexFmt.type = SNORM_INT8; (int)srcTexFmt.type < 0x23;
        srcTexFmt.type = srcTexFmt.type + SNORM_INT16) {
      dVar3 = init::colorFormats[(int)srcFormat];
      TVar16 = glu::mapGLInternalFormat(dVar3);
      srcType = TVar16.type;
      TVar10 = tcu::getTextureChannelClass(srcType);
      dVar11 = init::colorFormats[(int)srcTexFmt.type];
      register0x00000000 = glu::mapGLInternalFormat(dVar11);
      name_2.field_2._8_4_ = tcu::getTextureChannelClass(dstType);
      local_891 = TVar10 == TEXTURECHANNELCLASS_FLOATING_POINT ||
                  TVar10 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
      local_892 = name_2.field_2._8_4_ == TEXTURECHANNELCLASS_FLOATING_POINT ||
                  name_2.field_2._8_4_ == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
      if (((local_891 == local_892) &&
          ((TVar10 == TEXTURECHANNELCLASS_SIGNED_INTEGER) ==
           (name_2.field_2._8_4_ == TEXTURECHANNELCLASS_SIGNED_INTEGER))) &&
         ((TVar10 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ==
          (name_2.field_2._8_4_ == TEXTURECHANNELCLASS_UNSIGNED_INTEGER))) {
        pcVar15 = FboTestUtil::getFormatName(dVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar15,&local_2e9);
        std::operator+(&local_2c8,&local_2e8,"_to_");
        pcVar15 = FboTestUtil::getFormatName(dVar11);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,&local_2c8,pcVar15);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator(&local_2e9);
        this_00 = (BlitColorConversionCase *)operator_new(0x98);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        pcVar15 = (char *)std::__cxx11::string::c_str();
        tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&depthStencilGroup + 4),0x7f,0x71);
        BlitColorConversionCase::BlitColorConversionCase
                  (this_00,pCVar4,pcVar15,"",dVar3,dVar11,(IVec2 *)((long)&depthStencilGroup + 4));
        tcu::TestNode::addChild(pTVar12,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_2a8);
      }
    }
  }
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_stencil","Depth and stencil blits");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  for (texFmt.type = SNORM_INT8; (int)texFmt.type < 6; texFmt.type = texFmt.type + SNORM_INT16) {
    dVar3 = init::depthStencilFormats[(int)texFmt.type];
    fmtName.field_2._8_8_ = glu::mapGLInternalFormat(dVar3);
    pcVar15 = FboTestUtil::getFormatName(dVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&buffers,pcVar15,&local_331);
    std::allocator<char>::~allocator(&local_331);
    local_8f1 = fmtName.field_2._8_4_ == 0x12 || fmtName.field_2._8_4_ == 0x14;
    local_332 = local_8f1;
    local_8f2 = fmtName.field_2._8_4_ == 0x13 || fmtName.field_2._8_4_ == 0x14;
    local_333 = local_8f2;
    local_338 = (uint)local_8f1 << 8 | (uint)local_8f2 << 10;
    pBVar17 = (BlitDepthStencilCase *)operator_new(200);
    local_389 = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffers,
                   "_basic");
    pcVar15 = (char *)std::__cxx11::string::c_str();
    uVar6 = local_338;
    tcu::Vector<int,_2>::Vector(&local_360,0x80,0x80);
    tcu::Vector<int,_4>::Vector(&local_370,0,0,0x80,0x80);
    uVar7 = local_338;
    tcu::Vector<int,_2>::Vector(&local_378,0x80,0x80);
    tcu::Vector<int,_4>::Vector(&local_388,0,0,0x80,0x80);
    BlitDepthStencilCase::BlitDepthStencilCase
              (pBVar17,pCVar4,pcVar15,"",dVar3,uVar6,&local_360,&local_370,uVar7,&local_378,
               &local_388,local_338);
    local_389 = 0;
    tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar17);
    std::__cxx11::string::~string((string *)&local_358);
    pBVar17 = (BlitDepthStencilCase *)operator_new(200);
    local_3e1 = 1;
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffers,
                   "_scale");
    pcVar15 = (char *)std::__cxx11::string::c_str();
    uVar6 = local_338;
    tcu::Vector<int,_2>::Vector(&local_3b8,0x7f,0x77);
    tcu::Vector<int,_4>::Vector(&local_3c8,10,0x1e,100,0x46);
    uVar7 = local_338;
    tcu::Vector<int,_2>::Vector(&local_3d0,0x6f,0x82);
    tcu::Vector<int,_4>::Vector(&local_3e0,0x14,5,0x50,0x82);
    BlitDepthStencilCase::BlitDepthStencilCase
              (pBVar17,pCVar4,pcVar15,"",dVar3,uVar6,&local_3b8,&local_3c8,uVar7,&local_3d0,
               &local_3e0,local_338);
    local_3e1 = 0;
    tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar17);
    std::__cxx11::string::~string((string *)&local_3b0);
    if (((local_332 & 1U) != 0) && ((local_333 & 1U) != 0)) {
      pBVar17 = (BlitDepthStencilCase *)operator_new(200);
      local_439 = 1;
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_408,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffers,
                     "_depth_only");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      uVar6 = local_338;
      tcu::Vector<int,_2>::Vector(&local_410,0x80,0x80);
      tcu::Vector<int,_4>::Vector(&local_420,0,0,0x80,0x80);
      uVar7 = local_338;
      tcu::Vector<int,_2>::Vector(&local_428,0x80,0x80);
      tcu::Vector<int,_4>::Vector(&local_438,0,0,0x80,0x80);
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar17,pCVar4,pcVar15,"",dVar3,uVar6,&local_410,&local_420,uVar7,&local_428,
                 &local_438,0x100);
      local_439 = 0;
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar17);
      std::__cxx11::string::~string((string *)&local_408);
      pBVar17 = (BlitDepthStencilCase *)operator_new(200);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffers,
                     "_stencil_only");
      pcVar15 = (char *)std::__cxx11::string::c_str();
      uVar6 = local_338;
      tcu::Vector<int,_2>::Vector(&local_468,0x80,0x80);
      tcu::Vector<int,_4>::Vector(&local_478,0,0,0x80,0x80);
      uVar7 = local_338;
      tcu::Vector<int,_2>::Vector(&local_480,0x80,0x80);
      tcu::Vector<int,_4>::Vector(&local_490,0,0,0x80,0x80);
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar17,pCVar4,pcVar15,"",dVar3,uVar6,&local_468,&local_478,uVar7,&local_480,
                 &local_490,0x400);
      tcu::TestNode::addChild(pTVar12,(TestNode *)pBVar17);
      std::__cxx11::string::~string((string *)&local_460);
    }
    std::__cxx11::string::~string((string *)&buffers);
  }
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "default_framebuffer","Blits with default framebuffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  texFmt_1.type = SNORM_INT8;
  uVar19 = extraout_RAX;
  while ((int)texFmt_1.type < 0x23) {
    dVar3 = init::colorFormats[(int)texFmt_1.type];
    TVar16 = glu::mapGLInternalFormat(dVar3);
    fmtClass = TVar16.type;
    TVar10 = tcu::getTextureChannelClass(fmtClass);
    bVar8 = glu::isGLInternalColorFormatFilterable(dVar3);
    dVar11 = 0x2600;
    if (bVar8) {
      dVar11 = 0x2601;
    }
    name_3.field_2._M_local_buf[0xf] = glu::isGLInternalColorFormatFilterable(dVar3);
    if (((TVar10 == TEXTURECHANNELCLASS_FLOATING_POINT) ||
        (TVar10 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) ||
       (TVar10 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) {
      this_01 = (BlitDefaultFramebufferCase *)operator_new(0x90);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar15 = FboTestUtil::getFormatName(dVar3);
      BlitDefaultFramebufferCase::BlitDefaultFramebufferCase(this_01,pCVar4,pcVar15,"",dVar3,dVar11)
      ;
      tcu::TestNode::addChild(pTVar12,(TestNode *)this_01);
      for (name_3.field_2._8_4_ = 0; (int)name_3.field_2._8_4_ < 2;
          name_3.field_2._8_4_ = name_3.field_2._8_4_ + 1) {
        pcVar15 = init::areas[(int)name_3.field_2._8_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_4e0,pcVar15,&local_4e1);
        std::allocator<char>::~allocator(&local_4e1);
        local_4e2 = name_3.field_2._M_local_buf[0xf] & 1;
        local_9f1 = true;
        if (local_4e2 != 0) {
          local_9f1 = init::areas[(int)name_3.field_2._8_4_].area != AREA_OUT_OF_BOUNDS;
        }
        local_4e3 = local_9f1;
        if (local_9f1 != false) {
          pDVar18 = (DefaultFramebufferBlitCase *)operator_new(200);
          local_56a = 1;
          pCVar4 = (this->super_TestCaseGroup).m_context;
          pcVar15 = FboTestUtil::getFormatName(dVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_568,pcVar15,&local_569);
          std::operator+(&local_548,&local_568,"_nearest_");
          std::operator+(&local_528,&local_548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e0);
          std::operator+(&local_508,&local_528,"_blit_from_default");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                    (pDVar18,pCVar4,pcVar15,"",dVar3,0x2600,BLIT_DEFAULT_TO_TARGET,
                     init::areas[(int)name_3.field_2._8_4_].area);
          local_56a = 0;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pDVar18);
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_568);
          std::allocator<char>::~allocator(&local_569);
          pDVar18 = (DefaultFramebufferBlitCase *)operator_new(200);
          local_5f2 = 1;
          pCVar4 = (this->super_TestCaseGroup).m_context;
          pcVar15 = FboTestUtil::getFormatName(dVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f0,pcVar15,&local_5f1);
          std::operator+(&local_5d0,&local_5f0,"_nearest_");
          std::operator+(&local_5b0,&local_5d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e0);
          std::operator+(&local_590,&local_5b0,"_blit_to_default");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                    (pDVar18,pCVar4,pcVar15,"",dVar3,0x2600,BLIT_TO_DEFAULT_FROM_TARGET,
                     init::areas[(int)name_3.field_2._8_4_].area);
          local_5f2 = 0;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pDVar18);
          std::__cxx11::string::~string((string *)&local_590);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::allocator<char>::~allocator(&local_5f1);
        }
        if ((local_4e2 & 1) != 0) {
          pDVar18 = (DefaultFramebufferBlitCase *)operator_new(200);
          local_67a = 1;
          pCVar4 = (this->super_TestCaseGroup).m_context;
          pcVar15 = FboTestUtil::getFormatName(dVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_678,pcVar15,&local_679);
          std::operator+(&local_658,&local_678,"_linear_");
          std::operator+(&local_638,&local_658,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e0);
          std::operator+(&local_618,&local_638,"_blit_from_default");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                    (pDVar18,pCVar4,pcVar15,"",dVar3,0x2601,BLIT_DEFAULT_TO_TARGET,
                     init::areas[(int)name_3.field_2._8_4_].area);
          local_67a = 0;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pDVar18);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::string::~string((string *)&local_678);
          std::allocator<char>::~allocator(&local_679);
          pDVar18 = (DefaultFramebufferBlitCase *)operator_new(200);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          pcVar15 = FboTestUtil::getFormatName(dVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_700,pcVar15,&local_701);
          std::operator+(&local_6e0,&local_700,"_linear_");
          std::operator+(&local_6c0,&local_6e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e0);
          std::operator+(&local_6a0,&local_6c0,"_blit_to_default");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                    (pDVar18,pCVar4,pcVar15,"",dVar3,0x2601,BLIT_TO_DEFAULT_FROM_TARGET,
                     init::areas[(int)name_3.field_2._8_4_].area);
          tcu::TestNode::addChild(pTVar12,(TestNode *)pDVar18);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_700);
          std::allocator<char>::~allocator(&local_701);
        }
        std::__cxx11::string::~string((string *)local_4e0);
      }
    }
    texFmt_1.type = texFmt_1.type + SNORM_INT16;
    uVar19 = (ulong)texFmt_1.type;
  }
  return (int)uVar19;
}

Assistant:

void FramebufferBlitTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .rect
	{
		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} copyRects[] =
		{
			{ "basic",						IVec4( 10,  20,  65, 100),		IVec4( 45,   5, 100,  85) },
			{ "scale",						IVec4( 10,  20,  65, 100),		IVec4( 25,  30, 125,  94) },
			{ "out_of_bounds",				IVec4(-10, -15, 100,  63),		IVec4( 50,  30, 136, 144) },
		};

		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} filterConsistencyRects[] =
		{
			{ "mag",						IVec4( 20,  10,  74, 88),		IVec4( 10,  10,  91, 101) },
			{ "min",						IVec4( 10,  20,  78, 100),		IVec4( 20,  20,  71,  80) },
			{ "out_of_bounds_mag",			IVec4( 21,  10,  73, 82),		IVec4( 11,  43, 141, 151) },
			{ "out_of_bounds_min",			IVec4( 11,  21,  77, 97),		IVec4( 80,  82, 135, 139) },
		};

		static const struct
		{
			const char* name;
			IVec4		srcSwizzle;
			IVec4		dstSwizzle;
		} swizzles[] =
		{
			{ DE_NULL,				IVec4(0,1,2,3),	IVec4(0,1,2,3) },
			{ "reverse_src_x",		IVec4(2,1,0,3), IVec4(0,1,2,3) },
			{ "reverse_src_y",		IVec4(0,3,2,1), IVec4(0,1,2,3) },
			{ "reverse_dst_x",		IVec4(0,1,2,3), IVec4(2,1,0,3) },
			{ "reverse_dst_y",		IVec4(0,1,2,3), IVec4(0,3,2,1) },
			{ "reverse_src_dst_x",	IVec4(2,1,0,3), IVec4(2,1,0,3) },
			{ "reverse_src_dst_y",	IVec4(0,3,2,1), IVec4(0,3,2,1) }
		};

		const IVec2 srcSize(127, 119);
		const IVec2 dstSize(132, 128);

		// Blit rectangle tests.
		tcu::TestCaseGroup* rectGroup = new tcu::TestCaseGroup(m_testCtx, "rect", "Blit rectangle tests");
		addChild(rectGroup);
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(copyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string(copyRects[rectNdx].name) + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= copyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= copyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitRectCase(m_context, (name + "_nearest").c_str(),	"", GL_NEAREST,	srcSize, srcRect, dstSize, dstRect));
				rectGroup->addChild(new BlitRectCase(m_context, (name + "_linear").c_str(),		"", GL_LINEAR,	srcSize, srcRect, dstSize, dstRect));
			}
		}

		// Nearest filter tests
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(filterConsistencyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string("nearest_consistency_") + filterConsistencyRects[rectNdx].name + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= filterConsistencyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= filterConsistencyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitNearestFilterConsistencyCase(m_context, name.c_str(), "Test consistency of the nearest filter", srcSize, srcRect, dstSize, dstRect));
			}
		}
	}

	// .conversion
	{
		tcu::TestCaseGroup* conversionGroup = new tcu::TestCaseGroup(m_testCtx, "conversion", "Color conversion tests");
		addChild(conversionGroup);

		for (int srcFmtNdx = 0; srcFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); srcFmtNdx++)
		{
			for (int dstFmtNdx = 0; dstFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); dstFmtNdx++)
			{
				deUint32					srcFormat	= colorFormats[srcFmtNdx];
				tcu::TextureFormat			srcTexFmt	= glu::mapGLInternalFormat(srcFormat);
				tcu::TextureChannelClass	srcType		= tcu::getTextureChannelClass(srcTexFmt.type);
				deUint32					dstFormat	= colorFormats[dstFmtNdx];
				tcu::TextureFormat			dstTexFmt	= glu::mapGLInternalFormat(dstFormat);
				tcu::TextureChannelClass	dstType		= tcu::getTextureChannelClass(dstTexFmt.type);

				if (((srcType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) !=
					 (dstType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)))
					continue; // Conversion not supported.

				string						name		= string(getFormatName(srcFormat)) + "_to_" + getFormatName(dstFormat);

				conversionGroup->addChild(new BlitColorConversionCase(m_context, name.c_str(), "", srcFormat, dstFormat, IVec2(127, 113)));
			}
		}
	}

	// .depth_stencil
	{
		tcu::TestCaseGroup* depthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "depth_stencil", "Depth and stencil blits");
		addChild(depthStencilGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
		{
			deUint32			format		= depthStencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);
			string				fmtName		= getFormatName(format);
			bool				depth		= texFmt.order == tcu::TextureFormat::D || texFmt.order == tcu::TextureFormat::DS;
			bool				stencil		= texFmt.order == tcu::TextureFormat::S || texFmt.order == tcu::TextureFormat::DS;
			deUint32			buffers		= (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0);

			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_basic").c_str(), "", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers));
			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_scale").c_str(), "", format, buffers, IVec2(127, 119), IVec4(10, 30, 100, 70), buffers, IVec2(111, 130), IVec4(20, 5, 80, 130), buffers));

			if (depth && stencil)
			{
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_depth_only").c_str(),		"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_DEPTH_BUFFER_BIT));
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_stencil_only").c_str(),	"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_STENCIL_BUFFER_BIT));
			}
		}
	}

	// .default_framebuffer
	{
		static const struct
		{
			const char*								name;
			DefaultFramebufferBlitCase::BlitArea	area;
		} areas[] =
		{
			{ "scale",						DefaultFramebufferBlitCase::AREA_SCALE			},
			{ "out_of_bounds",				DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS	},
		};

		tcu::TestCaseGroup* defaultFbGroup = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Blits with default framebuffer");
		addChild(defaultFbGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			const deUint32					format		= colorFormats[fmtNdx];
			const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(format);
			const tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			const deUint32					filter		= glu::isGLInternalColorFormatFilterable(format) ? GL_LINEAR : GL_NEAREST;
			const bool						filterable	= glu::isGLInternalColorFormatFilterable(format);

			if (fmtClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				continue; // Conversion not supported.

			defaultFbGroup->addChild(new BlitDefaultFramebufferCase(m_context, getFormatName(format), "", format, filter));

			for (int areaNdx = 0; areaNdx < DE_LENGTH_OF_ARRAY(areas); areaNdx++)
			{
				const string	name				= string(areas[areaNdx].name);
				const bool		addLinear			= filterable;
				const bool		addNearest			= !addLinear || (areas[areaNdx].area != DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS); // No need to check out-of-bounds with different filtering

				if (addNearest)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_from_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_to_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}

				if (addLinear)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_from_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_to_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}
			}
		}
	}
}